

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linker_kernel_1.cpp
# Opt level: O1

void __thiscall dlib::linker::linker(linker *this)

{
  this->_vptr_linker = (_func_int **)&PTR__linker_0031aac8;
  this->running = false;
  mutex::mutex(&this->running_mutex);
  signaler::signaler(&this->running_signaler,&this->running_mutex);
  this->A = (connection *)0x0;
  this->B = (connection *)0x0;
  mutex::mutex(&this->cons_mutex);
  mutex::mutex(&this->service_connection_running_mutex);
  signaler::signaler(&this->service_connection_running_signaler,
                     &this->service_connection_running_mutex);
  mutex::mutex(&this->service_connection_error_mutex);
  return;
}

Assistant:

linker::
    linker (
    ) :
        running(false),
        running_signaler(running_mutex),
        A(0),
        B(0),
        service_connection_running_signaler(service_connection_running_mutex)
    {
    }